

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_pkg.c
# Opt level: O2

void dill_lookup_xfer_addrs(call_t *t,xfer_entry *x)

{
  call_location *pcVar1;
  int iVar2;
  void **ppvVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = 0;
  uVar5 = (ulong)(uint)t->call_count;
  if (t->call_count < 1) {
    uVar5 = uVar4;
  }
  for (; ppvVar3 = &x->xfer_addr, uVar4 != uVar5; uVar4 = uVar4 + 1) {
    for (; ((xfer_entry *)(ppvVar3 + -1))->xfer_name != (char *)0x0; ppvVar3 = ppvVar3 + 2) {
      pcVar1 = t->call_locs;
      iVar2 = strcmp(((xfer_entry *)(ppvVar3 + -1))->xfer_name,pcVar1[uVar4].xfer_name);
      if (iVar2 == 0) {
        pcVar1[uVar4].xfer_addr = *ppvVar3;
      }
    }
  }
  return;
}

Assistant:

extern void
dill_lookup_xfer_addrs(call_t* t, xfer_entry* x)
{
    int i;
    for (i = 0; i < t->call_count; i++) {
        xfer_entry* e = x;
        while (e->xfer_name != NULL) {
            if (strcmp(e->xfer_name, t->call_locs[i].xfer_name) == 0) {
                t->call_locs[i].xfer_addr = e->xfer_addr;
            }
            e++;
        }
    }
}